

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_clusterizer.h
# Opt level: O0

void __thiscall
crnlib::clusterizer<crnlib::vec<6U,_float>_>::compute_split_estimate
          (clusterizer<crnlib::vec<6U,_float>_> *this,vec<6U,_float> *left_child_res,
          vec<6U,_float> *right_child_res,vq_node *parent_node)

{
  float fVar1;
  uint uVar2;
  uint *puVar3;
  vec<6U,_float> *in_RCX;
  vec<6U,_float> *in_RDX;
  vec<6U,_float> *in_RSI;
  vector<std::pair<crnlib::vec<6U,_float>,_unsigned_int>_> *in_RDI;
  float fVar4;
  double dist_1;
  vec<6U,_float> *v_1;
  uint i_1;
  double opposite_dist;
  vec<6U,_float> opposite;
  double dist;
  vec<6U,_float> *v;
  uint i;
  double furthest_dist;
  vec<6U,_float> furthest;
  float in_stack_fffffffffffffefc;
  undefined4 in_stack_ffffffffffffff00;
  uint uVar5;
  undefined4 in_stack_ffffffffffffff04;
  vec<6U,_float> *in_stack_ffffffffffffff10;
  vec<6U,_float> *in_stack_ffffffffffffff18;
  vec<6U,_float> local_d8 [2];
  vec<6U,_float> local_a8;
  double local_90;
  pair<crnlib::vec<6U,_float>,_unsigned_int> *local_88;
  uint local_7c;
  double local_78;
  vec<6U,_float> local_70;
  double local_58;
  pair<crnlib::vec<6U,_float>,_unsigned_int> *local_50;
  float local_44;
  double local_40;
  vec<6U,_float> local_38;
  vec<6U,_float> *local_20;
  vec<6U,_float> *local_18;
  vec<6U,_float> *local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  vec<6U,_float>::vec((vec<6U,_float> *)
                      CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                      in_stack_fffffffffffffefc);
  local_40 = -1.0;
  local_44 = 0.0;
  while( true ) {
    fVar4 = local_44;
    fVar1 = (float)vector<unsigned_int>::size((vector<unsigned_int> *)(local_20[1].m_s + 4));
    if ((uint)fVar1 <= (uint)fVar4) break;
    puVar3 = vector<unsigned_int>::operator[]
                       ((vector<unsigned_int> *)(local_20[1].m_s + 4),(uint)local_44);
    local_50 = vector<std::pair<crnlib::vec<6U,_float>,_unsigned_int>_>::operator[](in_RDI,*puVar3);
    fVar4 = vec<6U,_float>::squared_distance(&local_50->first,local_20);
    local_58 = (double)fVar4;
    if (local_40 < local_58) {
      local_40 = local_58;
      vec<6U,_float>::operator=(&local_38,&local_50->first);
    }
    local_44 = (float)((int)local_44 + 1);
  }
  vec<6U,_float>::vec((vec<6U,_float> *)CONCAT44(fVar4,in_stack_ffffffffffffff00),
                      in_stack_fffffffffffffefc);
  local_78 = -1.0;
  local_7c = 0;
  while( true ) {
    uVar5 = local_7c;
    uVar2 = vector<unsigned_int>::size((vector<unsigned_int> *)(local_20[1].m_s + 4));
    if (uVar2 <= uVar5) break;
    puVar3 = vector<unsigned_int>::operator[]
                       ((vector<unsigned_int> *)(local_20[1].m_s + 4),local_7c);
    local_88 = vector<std::pair<crnlib::vec<6U,_float>,_unsigned_int>_>::operator[](in_RDI,*puVar3);
    fVar1 = vec<6U,_float>::squared_distance(&local_88->first,&local_38);
    local_90 = (double)fVar1;
    if (local_78 < local_90) {
      local_78 = local_90;
      vec<6U,_float>::operator=(&local_70,&local_88->first);
    }
    local_7c = local_7c + 1;
  }
  operator+(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  crnlib::operator*((vec<6U,_float> *)in_RDI,fVar4);
  vec<6U,_float>::operator=(local_10,&local_a8);
  operator+(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  crnlib::operator*((vec<6U,_float> *)in_RDI,fVar4);
  vec<6U,_float>::operator=(local_18,local_d8);
  return;
}

Assistant:

void compute_split_estimate(VectorType& left_child_res, VectorType& right_child_res, const vq_node& parent_node) {
    VectorType furthest(0);
    double furthest_dist = -1.0f;

    for (uint i = 0; i < parent_node.m_vectors.size(); i++) {
      const VectorType& v = m_training_vecs[parent_node.m_vectors[i]].first;

      double dist = v.squared_distance(parent_node.m_centroid);
      if (dist > furthest_dist) {
        furthest_dist = dist;
        furthest = v;
      }
    }

    VectorType opposite(0);
    double opposite_dist = -1.0f;

    for (uint i = 0; i < parent_node.m_vectors.size(); i++) {
      const VectorType& v = m_training_vecs[parent_node.m_vectors[i]].first;

      double dist = v.squared_distance(furthest);
      if (dist > opposite_dist) {
        opposite_dist = dist;
        opposite = v;
      }
    }

    left_child_res = (furthest + parent_node.m_centroid) * .5f;
    right_child_res = (opposite + parent_node.m_centroid) * .5f;
  }